

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O0

void __thiscall pstack::Dwarf::Unit::load(Unit *this)

{
  Off off_;
  element_type *this_00;
  Section *pSVar1;
  unsigned_long end_;
  undefined1 local_a0 [24];
  uintmax_t code;
  undefined1 local_78 [8];
  DWARFReader abbR;
  allocator<char> local_39;
  string local_38;
  Section *local_18;
  Section *abbrev;
  Unit *this_local;
  
  abbrev = (Section *)this;
  this_00 = std::__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->dwarf->elf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,".debug_abbrev",&local_39);
  pSVar1 = Elf::Object::getDebugSection(this_00,&local_38,0);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = pSVar1;
  Elf::Section::io((Section *)&code);
  off_ = this->abbrevOffset;
  end_ = std::numeric_limits<unsigned_long>::max();
  DWARFReader::DWARFReader((DWARFReader *)local_78,(csptr *)&code,off_,end_);
  std::shared_ptr<const_pstack::Reader>::~shared_ptr((shared_ptr<const_pstack::Reader> *)&code);
  while( true ) {
    local_a0._16_8_ = DWARFReader::getuleb128((DWARFReader *)local_78);
    if ((element_type *)local_a0._16_8_ == (element_type *)0x0) break;
    std::forward_as_tuple<unsigned_long&>((unsigned_long *)(local_a0 + 8));
    std::forward_as_tuple<pstack::Dwarf::DWARFReader&>((DWARFReader *)local_a0);
    std::
    unordered_map<unsigned_long,pstack::Dwarf::Abbreviation,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,pstack::Dwarf::Abbreviation>>>
    ::
    emplace<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<pstack::Dwarf::DWARFReader&>>
              ((unordered_map<unsigned_long,pstack::Dwarf::Abbreviation,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,pstack::Dwarf::Abbreviation>>>
                *)&this->abbreviations,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<unsigned_long_&> *)(local_a0 + 8),
               (tuple<pstack::Dwarf::DWARFReader_&> *)local_a0);
  }
  DWARFReader::~DWARFReader((DWARFReader *)local_78);
  return;
}

Assistant:

void
Unit::load()
{
    auto &abbrev { dwarf->elf->getDebugSection(".debug_abbrev", SHT_NULL) };
    DWARFReader abbR(abbrev.io(), abbrevOffset);
    uintmax_t code;
    while ((code = abbR.getuleb128()) != 0)
        abbreviations.emplace(std::piecewise_construct,
                std::forward_as_tuple(code),
                std::forward_as_tuple(abbR));
}